

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O3

void Extra_bddImageTreeDelete_rec(Extra_ImageNode_t *pNode)

{
  if (pNode->pNode1 != (Extra_ImageNode_t *)0x0) {
    Extra_bddImageTreeDelete_rec(pNode->pNode1);
  }
  if (pNode->pNode2 != (Extra_ImageNode_t *)0x0) {
    Extra_bddImageTreeDelete_rec(pNode->pNode2);
  }
  if (pNode->bCube != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pNode->dd,pNode->bCube);
  }
  if (pNode->bImage != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pNode->dd,pNode->bImage);
  }
  if (pNode->pPart == (Extra_ImagePart_t *)0x0) {
    free(pNode);
    return;
  }
  __assert_fail("pNode->pPart == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                ,0x22b,"void Extra_bddImageTreeDelete_rec(Extra_ImageNode_t *)");
}

Assistant:

void Extra_bddImageTreeDelete_rec( Extra_ImageNode_t * pNode )
{
    if ( pNode->pNode1 )
        Extra_bddImageTreeDelete_rec( pNode->pNode1 );
    if ( pNode->pNode2 )
        Extra_bddImageTreeDelete_rec( pNode->pNode2 );
    if ( pNode->bCube )
        Cudd_RecursiveDeref( pNode->dd, pNode->bCube );
    if ( pNode->bImage )
        Cudd_RecursiveDeref( pNode->dd, pNode->bImage );
    assert( pNode->pPart == NULL );
    ABC_FREE( pNode );
}